

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::TexSubImage2DAlignCase::TexSubImage2DAlignCase
          (TexSubImage2DAlignCase *this,Context *context,char *name,char *desc,
          deUint32 internalFormat,int width,int height,int subX,int subY,int subW,int subH,
          int alignment)

{
  TransferFormat TVar1;
  deUint32 local_40;
  deUint32 dStack_3c;
  TransferFormat fmt;
  int width_local;
  deUint32 internalFormat_local;
  char *desc_local;
  char *name_local;
  Context *context_local;
  TexSubImage2DAlignCase *this_local;
  
  fmt = (TransferFormat)glu::mapGLInternalFormat(internalFormat);
  Texture2DSpecCase::Texture2DSpecCase
            (&this->super_Texture2DSpecCase,context,name,desc,(TextureFormat *)&fmt,width,height,1);
  (this->super_Texture2DSpecCase).super_TextureSpecCase.super_TestCase.super_TestCase.super_TestNode
  ._vptr_TestNode = (_func_int **)&PTR__TexSubImage2DAlignCase_01598ae0;
  *(deUint32 *)&(this->super_Texture2DSpecCase).field_0xd4 = internalFormat;
  this->m_format = 0;
  this->m_dataType = 0;
  this->m_subX = subX;
  this->m_subY = subY;
  this->m_subW = subW;
  this->m_subH = subH;
  this->m_alignment = alignment;
  TVar1 = glu::getTransferFormat((this->super_Texture2DSpecCase).m_texFormat);
  local_40 = TVar1.format;
  this->m_format = local_40;
  dStack_3c = TVar1.dataType;
  this->m_dataType = dStack_3c;
  return;
}

Assistant:

TexSubImage2DAlignCase (Context& context, const char* name, const char* desc, deUint32 internalFormat, int width, int height, int subX, int subY, int subW, int subH, int alignment)
		: Texture2DSpecCase	(context, name, desc, glu::mapGLInternalFormat(internalFormat), width, height, 1)
		, m_internalFormat	(internalFormat)
		, m_format			(GL_NONE)
		, m_dataType		(GL_NONE)
		, m_subX			(subX)
		, m_subY			(subY)
		, m_subW			(subW)
		, m_subH			(subH)
		, m_alignment		(alignment)
	{
		glu::TransferFormat fmt = glu::getTransferFormat(m_texFormat);
		m_format	= fmt.format;
		m_dataType	= fmt.dataType;
	}